

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O2

void __thiscall QMenuBarPrivate::calcActionRects(QMenuBarPrivate *this,int max_width,int start)

{
  QList<QRect> *this_00;
  QRect *this_01;
  int iVar1;
  long lVar2;
  QWidget *this_02;
  QAction *pQVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  LayoutDirection direction;
  QStyle *pQVar11;
  QStyle *pQVar12;
  pointer pQVar13;
  int iVar14;
  int iVar15;
  int i;
  ulong uVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  long in_FS_OFFSET;
  QRect QVar23;
  ulong local_150;
  QIcon is;
  undefined8 local_e8;
  QFontMetrics fm;
  QStyleOptionMenuItem opt;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->super_QWidgetPrivate).field_0x254 & 1) != 0) {
    this_02 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    this_00 = &this->actionRects;
    QList<QRect>::resize(this_00,(this->super_QWidgetPrivate).actions.d.size);
    opt.super_QStyleOption._0_16_ = ZEXT816(0xffffffffffffffff) << 0x40;
    QList<QRect>::fill(this_00,(parameter_type)&opt,-1);
    pQVar11 = QWidget::style(this_02);
    iVar6 = (**(code **)(*(long *)pQVar11 + 0xe0))(pQVar11,0x22,0,this_02);
    _fm = &DAT_aaaaaaaaaaaaaaaa;
    QWidget::fontMetrics((QWidget *)&fm);
    iVar7 = (**(code **)(*(long *)pQVar11 + 0xe0))(pQVar11,0x24,0,this_02);
    iVar8 = (**(code **)(*(long *)pQVar11 + 0xe0))(pQVar11,0x23,0,this_02);
    iVar9 = (**(code **)(*(long *)pQVar11 + 0xe0))(pQVar11,0x3e,0);
    uVar20 = 0xffffffffffffffff;
    lVar17 = 0xc;
    uVar16 = 0;
    local_150 = 0;
    iVar1 = 0;
    iVar15 = 0;
    while( true ) {
      iVar19 = (int)uVar20;
      iVar10 = (int)local_150;
      if ((ulong)(this->super_QWidgetPrivate).actions.d.size <= uVar16) break;
      pQVar3 = (this->super_QWidgetPrivate).actions.d.ptr[uVar16];
      cVar4 = QAction::isVisible();
      if (cVar4 != '\0') {
        local_e8 = 0xffffffffffffffff;
        cVar4 = QAction::isSeparator();
        if (cVar4 == '\0') {
          opt.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          opt.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          opt.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QAction::text();
          is.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
          QAction::icon();
          cVar4 = QIcon::isNull();
          if (cVar4 == '\0') {
            iVar21 = (int)local_e8;
            if ((int)local_e8 <= iVar9) {
              iVar21 = iVar9;
            }
            if (local_e8._4_4_ <= iVar9) {
              local_e8._4_4_ = iVar9;
            }
            local_e8 = CONCAT44(local_e8._4_4_,iVar21);
          }
          else if (opt.super_QStyleOption.rect._0_8_ != 0) {
            local_e8 = QFontMetrics::size((int)&fm,(QString *)0x800,(int)&opt,(int *)0x0);
          }
          QIcon::~QIcon(&is);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&opt);
          memset(&opt,0xaa,0x98);
          QStyleOptionMenuItem::QStyleOptionMenuItem(&opt);
          (**(code **)(*(long *)this_02 + 0x1a0))(this_02,&opt,pQVar3);
          pQVar12 = QWidget::style(this_02);
          local_e8 = (**(code **)(*(long *)pQVar12 + 0xe8))(pQVar12,8,&opt,&local_e8,this_02);
          iVar21 = (int)local_e8;
          iVar22 = (int)(local_e8 >> 0x20);
          if (0 < iVar22 && 0 < iVar21) {
            iVar14 = iVar6 + iVar21;
            iVar18 = 0;
            if (iVar19 == -1) {
              iVar18 = iVar14;
              iVar14 = 0;
            }
            iVar1 = iVar1 + iVar14;
            iVar15 = iVar15 + iVar18;
            if (iVar10 <= iVar22) {
              local_150 = local_e8 >> 0x20;
            }
            pQVar13 = QList<QRect>::data(this_00);
            *(undefined8 *)((long)pQVar13 + lVar17 + -0xc) = 0;
            *(int *)((long)pQVar13 + lVar17 + -4) = iVar21 + -1;
            *(int *)((long)&(pQVar13->x1).m_i + lVar17) = iVar22 + -1;
          }
          uVar20 = uVar20 & 0xffffffff;
          QStyleOptionMenuItem::~QStyleOptionMenuItem(&opt);
        }
        else {
          iVar10 = (**(code **)(*(long *)pQVar11 + 0xf0))(pQVar11,0x2f,0,this_02,0);
          if (iVar10 != 0) {
            uVar20 = uVar16;
          }
          uVar20 = uVar20 & 0xffffffff;
        }
      }
      uVar16 = uVar16 + 1;
      lVar17 = lVar17 + 0x10;
    }
    pQVar11 = QWidget::style(this_02);
    lVar17 = 0;
    iVar9 = (**(code **)(*(long *)pQVar11 + 0xe0))(pQVar11,0x21,0,this_02);
    if (start == -1) {
      start = iVar7;
    }
    iVar21 = start + iVar6 + iVar9;
    iVar8 = iVar8 + iVar9;
    for (uVar20 = 0; uVar20 < (ulong)(this->super_QWidgetPrivate).actions.d.size;
        uVar20 = uVar20 + 1) {
      pQVar13 = QList<QRect>::data(this_00);
      this_01 = (QRect *)((long)&(pQVar13->x1).m_i + lVar17);
      bVar5 = QRect::isNull(this_01);
      if (!bVar5) {
        iVar9 = iVar21;
        if ((long)iVar19 <= (long)uVar20 && iVar19 != -1) {
          iVar21 = (max_width + iVar21) - (iVar6 + iVar7 * 2 + iVar1 + iVar15);
          if (iVar21 < iVar15) {
            iVar9 = iVar7;
          }
          iVar22 = 0;
          if (iVar21 < iVar15) {
            iVar22 = iVar10;
            iVar15 = iVar7;
          }
          iVar8 = iVar22 + iVar8;
        }
        iVar22 = (iVar21 - *(int *)((long)&(pQVar13->x1).m_i + lVar17)) +
                 *(int *)((long)&(pQVar13->x2).m_i + lVar17);
        *(int *)((long)&(pQVar13->x2).m_i + lVar17) = iVar22;
        *(int *)((long)&(pQVar13->x1).m_i + lVar17) = iVar21;
        *(int *)((long)&(pQVar13->y2).m_i + lVar17) = iVar10 + -1 + iVar8;
        *(int *)((long)&(pQVar13->y1).m_i + lVar17) = iVar8;
        iVar21 = (iVar22 + iVar9 + iVar6 + 1) - iVar21;
        direction = QWidget::layoutDirection(this_02);
        opt.super_QStyleOption._0_16_ = QWidget::rect(this_02);
        QVar23 = QStyle::visualRect(direction,(QRect *)&opt,this_01);
        *(long *)((long)&(pQVar13->x1).m_i + lVar17) = QVar23._0_8_;
        *(long *)((long)&(pQVar13->x2).m_i + lVar17) = QVar23._8_8_;
      }
      lVar17 = lVar17 + 0x10;
    }
    QFontMetrics::~QFontMetrics(&fm);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenuBarPrivate::calcActionRects(int max_width, int start) const
{
    Q_Q(const QMenuBar);

    if (!itemsDirty)
        return;

    //let's reinitialize the buffer
    actionRects.resize(actions.size());
    actionRects.fill(QRect());

    const QStyle *style = q->style();

    const int itemSpacing = style->pixelMetric(QStyle::PM_MenuBarItemSpacing, nullptr, q);
    int max_item_height = 0, separator = -1, separator_start = 0, separator_len = 0;

    //calculate size
    const QFontMetrics fm = q->fontMetrics();
    const int hmargin = style->pixelMetric(QStyle::PM_MenuBarHMargin, nullptr, q),
              vmargin = style->pixelMetric(QStyle::PM_MenuBarVMargin, nullptr, q),
                icone = style->pixelMetric(QStyle::PM_SmallIconSize, nullptr, q);
    for(int i = 0; i < actions.size(); i++) {
        QAction *action = actions.at(i);
        if (!action->isVisible())
            continue;

        QSize sz;

        //calc what I think the size is..
        if (action->isSeparator()) {
            if (style->styleHint(QStyle::SH_DrawMenuBarSeparator, nullptr, q))
                separator = i;
            continue; //we don't really position these!
        } else {
            const QString s = action->text();
            QIcon is = action->icon();
            // If an icon is set, only the icon is visible
            if (!is.isNull())
                sz = sz.expandedTo(QSize(icone, icone));
            else if (!s.isEmpty())
                sz = fm.size(Qt::TextShowMnemonic, s);
        }

        //let the style modify the above size..
        QStyleOptionMenuItem opt;
        q->initStyleOption(&opt, action);
        sz = q->style()->sizeFromContents(QStyle::CT_MenuBarItem, &opt, sz, q);

        if (!sz.isEmpty()) {
            { //update the separator state
                int iWidth = sz.width() + itemSpacing;
                if (separator == -1)
                    separator_start += iWidth;
                else
                    separator_len += iWidth;
            }
            //maximum height
            max_item_height = qMax(max_item_height, sz.height());
            //append
            actionRects[i] = QRect(0, 0, sz.width(), sz.height());
        }
    }

    //calculate position
    const int fw = q->style()->pixelMetric(QStyle::PM_MenuBarPanelWidth, nullptr, q);
    int x = fw + ((start == -1) ? hmargin : start) + itemSpacing;
    int y = fw + vmargin;
    for(int i = 0; i < actions.size(); i++) {
        QRect &rect = actionRects[i];
        if (rect.isNull())
            continue;

        //resize
        rect.setHeight(max_item_height);

        //move
        if (separator != -1 && i >= separator) { //after the separator
            int left = (max_width - separator_len - hmargin - itemSpacing) + (x - separator_start - hmargin);
            if (left < separator_start) { //wrap
                separator_start = x = hmargin;
                y += max_item_height;
            }
            rect.moveLeft(left);
        } else {
            rect.moveLeft(x);
        }
        rect.moveTop(y);

        //keep moving along..
        x += rect.width() + itemSpacing;

        //make sure we follow the layout direction
        rect = QStyle::visualRect(q->layoutDirection(), q->rect(), rect);
    }
}